

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O2

UBool __thiscall icu_63::UVector32::removeAll(UVector32 *this,UVector32 *other)

{
  int32_t index;
  int32_t i;
  long lVar1;
  UBool UVar2;
  
  UVar2 = '\0';
  for (lVar1 = 0; lVar1 < other->count; lVar1 = lVar1 + 1) {
    index = indexOf(this,other->elements[lVar1],0);
    if (-1 < index) {
      removeElementAt(this,index);
      UVar2 = '\x01';
    }
  }
  return UVar2;
}

Assistant:

UBool UVector32::removeAll(const UVector32& other) {
    UBool changed = FALSE;
    for (int32_t i=0; i<other.size(); ++i) {
        int32_t j = indexOf(other.elements[i]);
        if (j >= 0) {
            removeElementAt(j);
            changed = TRUE;
        }
    }
    return changed;
}